

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_remove_checked(roaring_bitmap_t *r,uint32_t val)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  void **ppvVar4;
  bool bVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  ushort uVar8;
  shared_container_t *sc;
  run_container_t *prVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  run_container_t *prVar15;
  uint i;
  uint uVar16;
  uint uVar17;
  int iVar18;
  _Bool _Var19;
  uint8_t newtypecode;
  uint8_t local_39;
  ulong local_38;
  
  iVar18 = (r->high_low_container).size;
  if ((long)iVar18 != 0) {
    puVar2 = (r->high_low_container).keys;
    uVar8 = (ushort)(val >> 0x10);
    if (puVar2[(long)iVar18 + -1] != uVar8) {
      uVar16 = iVar18 - 1;
      uVar13 = 0;
      uVar17 = uVar16;
      do {
        if ((int)uVar16 < (int)uVar13) {
          i = ~uVar13;
          break;
        }
        i = uVar13 + uVar16 >> 1;
        uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar13 + uVar16 & 0xfffffffe));
        if (uVar1 < uVar8) {
          uVar13 = i + 1;
          bVar5 = true;
          i = uVar17;
        }
        else if (uVar8 < uVar1) {
          uVar16 = i - 1;
          bVar5 = true;
          i = uVar17;
        }
        else {
          bVar5 = false;
        }
        uVar17 = i;
      } while (bVar5);
      goto LAB_0011a95c;
    }
  }
  i = iVar18 - 1;
LAB_0011a95c:
  if ((int)i < 0) {
    _Var19 = false;
  }
  else {
    uVar17 = i & 0xffff;
    puVar3 = (r->high_low_container).typecodes;
    sc = (shared_container_t *)(r->high_low_container).containers[uVar17];
    if (puVar3[uVar17] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar17);
    }
    *(shared_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar17 * 8)) = sc;
    uVar7 = (r->high_low_container).typecodes[uVar17];
    prVar15 = *(run_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar17 * 8));
    prVar9 = prVar15;
    uVar6 = uVar7;
    if (uVar7 == '\x04') {
      uVar6 = *(uint8_t *)&prVar15->runs;
      prVar9 = *(run_container_t **)prVar15;
    }
    if (uVar6 == '\x03') {
      uVar17 = croaring_hardware_support();
      if ((uVar17 & 2) == 0) {
        uVar17 = croaring_hardware_support();
        if ((uVar17 & 1) == 0) {
          iVar18 = prVar9->n_runs;
          lVar10 = (long)iVar18;
          if (0 < lVar10) {
            lVar11 = 0;
            do {
              iVar18 = iVar18 + (uint)prVar9->runs[lVar11].length;
              lVar11 = lVar11 + 1;
            } while (lVar10 != lVar11);
          }
        }
        else {
          iVar18 = _avx2_run_container_cardinality(prVar9);
        }
      }
      else {
        iVar18 = _avx512_run_container_cardinality(prVar9);
      }
    }
    else {
      iVar18 = prVar9->n_runs;
    }
    local_39 = uVar7;
    prVar9 = (run_container_t *)container_remove(prVar15,(uint16_t)val,uVar7,&local_39);
    uVar14 = (ulong)i;
    if (prVar9 != prVar15) {
      container_free(prVar15,uVar7);
      (r->high_low_container).containers[uVar14] = prVar9;
      (r->high_low_container).typecodes[uVar14] = local_39;
    }
    uVar6 = local_39;
    prVar15 = prVar9;
    uVar7 = local_39;
    if (local_39 == '\x04') {
      uVar7 = *(uint8_t *)&prVar9->runs;
      prVar15 = *(run_container_t **)prVar9;
    }
    if (uVar7 == '\x03') {
      local_38 = uVar14;
      uVar17 = croaring_hardware_support();
      if ((uVar17 & 2) == 0) {
        uVar17 = croaring_hardware_support();
        if ((uVar17 & 1) == 0) {
          iVar12 = prVar15->n_runs;
          lVar10 = (long)iVar12;
          uVar14 = local_38;
          if (0 < lVar10) {
            lVar11 = 0;
            do {
              iVar12 = iVar12 + (uint)prVar15->runs[lVar11].length;
              lVar11 = lVar11 + 1;
            } while (lVar10 != lVar11);
          }
        }
        else {
          iVar12 = _avx2_run_container_cardinality(prVar15);
          uVar14 = local_38;
        }
      }
      else {
        iVar12 = _avx512_run_container_cardinality(prVar15);
        uVar14 = local_38;
      }
    }
    else {
      iVar12 = prVar15->n_runs;
    }
    ppvVar4 = (r->high_low_container).containers;
    if (iVar12 == 0) {
      container_free(ppvVar4[uVar14],(r->high_low_container).typecodes[uVar14]);
      ra_remove_at_index(&r->high_low_container,i);
    }
    else {
      ppvVar4[uVar14] = prVar9;
      (r->high_low_container).typecodes[uVar14] = uVar6;
    }
    _Var19 = iVar18 != iVar12;
  }
  return _Var19;
}

Assistant:

bool roaring_bitmap_remove_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }

        const int newCardinality =
            container_get_cardinality(container2, newtypecode);

        if (newCardinality != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }

        result = oldCardinality != newCardinality;
    }
    return result;
}